

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O3

int Dau_DsdMergeStatus_rec(char *pStr,char **p,int *pMatches,int nShared,int *pStatus)

{
  int iVar1;
  byte *pbVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  bool bVar10;
  
  pbVar7 = (byte *)*p;
  bVar9 = *pbVar7;
  pbVar2 = pbVar7;
  if (bVar9 == 0x21) {
    pStatus[(long)pbVar7 - (long)pStr] = -1;
    pbVar2 = pbVar7 + 1;
    *p = (char *)pbVar2;
    bVar9 = pbVar7[1];
  }
  if ((byte)(bVar9 + 0xbf) < 6 || (byte)(bVar9 - 0x30) < 10) {
    piVar3 = pStatus + ((long)pbVar2 - (long)pStr);
    do {
      pbVar2 = pbVar2 + 1;
      *piVar3 = -1;
      *p = (char *)pbVar2;
      bVar9 = *pbVar2;
      piVar3 = piVar3 + 1;
    } while ((byte)(bVar9 - 0x30) < 10 || (byte)(bVar9 + 0xbf) < 6);
  }
  pbVar7 = pbVar2;
  if (bVar9 == 0x3c) {
    lVar8 = (long)pMatches[(long)pbVar2 - (long)pStr];
    if (pStr[lVar8 + 1] == '{') {
      pbVar7 = (byte *)(pStr + lVar8 + 1);
      *p = (char *)pbVar7;
      if (pbVar2 < pbVar7) {
        lVar4 = 0;
        if (pbVar2 <= pStr + lVar8) {
          lVar4 = (long)(pStr + lVar8) - (long)pbVar2;
        }
        memset(pStatus + ((long)pbVar2 - (long)pStr),0xff,lVar4 * 4 + 4);
      }
    }
  }
  bVar9 = *pbVar7;
  if (0x19 < (byte)(bVar9 + 0x9f)) {
    uVar5 = (uint)bVar9;
    if (((0x3f < bVar9 - 0x3c) || ((0x8000000080000001U >> ((ulong)(bVar9 - 0x3c) & 0x3f) & 1) == 0)
        ) && (uVar5 != 0x28)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x157,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    lVar8 = (long)pbVar7 - (long)pStr;
    if (uVar5 + (uVar5 != 0x28) + 1 != (int)pStr[pMatches[lVar8]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x143,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    pbVar2 = (byte *)(pStr + pMatches[lVar8]);
    pbVar7 = pbVar7 + 1;
    *p = (char *)pbVar7;
    if (pbVar7 < pbVar2) {
      uVar6 = 0;
      uVar5 = 0;
      do {
        iVar1 = Dau_DsdMergeStatus_rec(pStr,p,pMatches,nShared,pStatus);
        uVar5 = uVar5 + (iVar1 == 3);
        pbVar7 = (byte *)(*p + 1);
        *p = (char *)pbVar7;
        uVar6 = uVar6 - 1;
      } while (pbVar7 < pbVar2);
      if (pbVar7 == pbVar2) {
        if (uVar6 == 0xffffffff) goto LAB_0051475a;
        if (1 < uVar5) {
          if (~uVar6 < uVar5) {
            bVar10 = -uVar6 != uVar5;
            uVar5 = 3;
            if (bVar10) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                            ,0x154,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)")
              ;
            }
          }
          else {
            uVar5 = 2;
          }
        }
        goto LAB_00514724;
      }
    }
    else if (pbVar7 == pbVar2) {
LAB_0051475a:
      __assert_fail("nTotal > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x14b,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    __assert_fail("*p == q",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x14a,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
  }
  uVar5 = (uint)(nShared <= (int)(uint)(byte)(bVar9 + 0x9f)) * 3;
  lVar8 = (long)pbVar7 - (long)pStr;
LAB_00514724:
  pStatus[lVar8] = uVar5;
  return uVar5;
}

Assistant:

int Dau_DsdMergeStatus_rec( char * pStr, char ** p, int * pMatches, int nShared, int * pStatus )
{
    // none pure
    // 1 one pure
    // 2 two or more pure
    // 3 all pure
    if ( **p == '!' )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            for ( ; pTemp < q+1; pTemp++ )
                pStatus[pTemp - pStr] = -1;
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return pStatus[*p - pStr] = (**p - 'a' < nShared) ? 0 : 3;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Status, nPure = 0, nTotal = 0;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Status = Dau_DsdMergeStatus_rec( pStr, p, pMatches, nShared, pStatus );
            nPure += (Status == 3);
            nTotal++;
        }
        assert( *p == q );
        assert( nTotal > 1 );
        if ( nPure == 0 )
            Status = 0;
        else if ( nPure == 1 )
            Status = 1;
        else if ( nPure < nTotal )
            Status = 2;
        else if ( nPure == nTotal ) 
            Status = 3;
        else assert( 0 );
        return (pStatus[pOld - pStr] = Status);
    }
    assert( 0 );
    return 0;
}